

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Optional<Catch::ColourMode> Catch::Detail::stringToColourMode(StringRef colourMode)

{
  int iVar1;
  ColourMode *pCVar2;
  ColourMode CVar3;
  long in_RDX;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  void *__s1;
  ColourMode *pCVar4;
  Optional<Catch::ColourMode> OVar5;
  
  __s1 = (void *)colourMode.m_size;
  pCVar4 = (ColourMode *)colourMode.m_start;
  if (in_RDX == 4) {
    iVar1 = bcmp(__s1,"ansi",4);
    if (iVar1 == 0) {
      CVar3 = ANSI;
      in_RDX = extraout_RDX_00;
    }
    else {
      iVar1 = bcmp(__s1,"none",4);
      in_RDX = extraout_RDX_02;
      if (iVar1 != 0) goto LAB_00147c38;
      CVar3 = None;
    }
LAB_00147c4a:
    pCVar2 = pCVar4 + 8;
    pCVar4[8] = CVar3;
  }
  else {
    if (in_RDX == 5) {
      iVar1 = bcmp(__s1,"win32",5);
      in_RDX = extraout_RDX_01;
      if (iVar1 == 0) {
        CVar3 = Win32;
        goto LAB_00147c4a;
      }
    }
    else if ((in_RDX == 7) && (iVar1 = bcmp(__s1,"default",7), in_RDX = extraout_RDX, iVar1 == 0)) {
      CVar3 = PlatformDefault;
      goto LAB_00147c4a;
    }
LAB_00147c38:
    pCVar2 = (ColourMode *)0x0;
  }
  *(ColourMode **)pCVar4 = pCVar2;
  OVar5._8_8_ = in_RDX;
  OVar5.nullableValue = pCVar4;
  return OVar5;
}

Assistant:

Optional<ColourMode> stringToColourMode( StringRef colourMode ) {
            if ( colourMode == "default" ) {
                return ColourMode::PlatformDefault;
            } else if ( colourMode == "ansi" ) {
                return ColourMode::ANSI;
            } else if ( colourMode == "win32" ) {
                return ColourMode::Win32;
            } else if ( colourMode == "none" ) {
                return ColourMode::None;
            } else {
                return {};
            }
        }